

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double insphereexact(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int i;
  int deterlen;
  double deter [5760];
  int cdlen;
  int ablen;
  double cdedet [3456];
  double cddet [2304];
  double abdet [2304];
  int elen;
  int dlen;
  int clen;
  int blen;
  int alen;
  double edet [1152];
  double ddet [1152];
  double cdet [1152];
  double bdet [1152];
  double adet [1152];
  int xylen;
  double detxy [768];
  int zlen;
  int ylen;
  int xlen;
  double det384z [384];
  double det384y [384];
  double det384x [384];
  double temp192 [192];
  int eabclen;
  int deablen;
  int cdealen;
  int bcdelen;
  int abcdlen;
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  int temp48blen;
  int temp48alen;
  double temp48b [48];
  double temp48a [48];
  int eaclen;
  int deblen;
  int cdalen;
  int bcelen;
  int abdlen;
  int eablen;
  int dealen;
  int cdelen;
  int bcdlen;
  int abclen;
  double eac [24];
  double deb [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  int temp16len;
  int temp8blen;
  int temp8alen;
  double temp16 [16];
  double temp8b [8];
  double temp8a [8];
  double eb [4];
  double da [4];
  double ce [4];
  double bd [4];
  double ac [4];
  double ea [4];
  double de [4];
  double cd [4];
  double bc [4];
  double ab [4];
  double bxey0;
  double axdy0;
  double excy0;
  double dxby0;
  double cxay0;
  double exby0;
  double dxay0;
  double cxey0;
  double bxdy0;
  double axcy0;
  double axey0;
  double exdy0;
  double dxcy0;
  double cxby0;
  double bxay0;
  double exay0;
  double dxey0;
  double cxdy0;
  double bxcy0;
  double axby0;
  double bxey1;
  double axdy1;
  double excy1;
  double dxby1;
  double cxay1;
  double exby1;
  double dxay1;
  double cxey1;
  double bxdy1;
  double axcy1;
  double axey1;
  double exdy1;
  double dxcy1;
  double cxby1;
  double bxay1;
  double exay1;
  double dxey1;
  double cxdy1;
  double bxcy1;
  double axby1;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar14 = splitter * *pa - (splitter * *pa - *pa);
  dVar15 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar14 = (*pa - dVar14) * (pb[1] - dVar15) +
           -(-dVar14 * (pb[1] - dVar15) + -(*pa - dVar14) * dVar15 + -dVar14 * dVar15 + *pa * pb[1])
  ;
  dVar15 = splitter * *pb - (splitter * *pb - *pb);
  dVar16 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar15 = (*pb - dVar15) * (pa[1] - dVar16) +
           -(-dVar15 * (pa[1] - dVar16) + -(*pb - dVar15) * dVar16 + -dVar15 * dVar16 + *pb * pa[1])
  ;
  dVar16 = dVar14 - dVar15;
  dVar17 = dVar14 - dVar16;
  bc[3] = (dVar14 - (dVar16 + dVar17)) + (dVar17 - dVar15);
  dVar14 = *pb * pc[1];
  dVar15 = splitter * *pb - (splitter * *pb - *pb);
  dVar16 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar15 = (*pb - dVar15) * (pc[1] - dVar16) +
           -(-dVar15 * (pc[1] - dVar16) + -(*pb - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pc * pb[1];
  dVar17 = splitter * *pc - (splitter * *pc - *pc);
  dVar18 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar17 = (*pc - dVar17) * (pb[1] - dVar18) +
           -(-dVar17 * (pb[1] - dVar18) + -(*pc - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  cd[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  bc[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  bc[2] = dVar15 + dVar17;
  bc[1] = (dVar15 - (bc[2] - (bc[2] - dVar15))) + (dVar17 - (bc[2] - dVar15));
  dVar14 = *pc * pd[1];
  dVar15 = splitter * *pc - (splitter * *pc - *pc);
  dVar16 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar15 = (*pc - dVar15) * (pd[1] - dVar16) +
           -(-dVar15 * (pd[1] - dVar16) + -(*pc - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pd * pc[1];
  dVar17 = splitter * *pd - (splitter * *pd - *pd);
  dVar18 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar17 = (*pd - dVar17) * (pc[1] - dVar18) +
           -(-dVar17 * (pc[1] - dVar18) + -(*pd - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  de[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  cd[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  cd[2] = dVar15 + dVar17;
  cd[1] = (dVar15 - (cd[2] - (cd[2] - dVar15))) + (dVar17 - (cd[2] - dVar15));
  dVar14 = *pd * pe[1];
  dVar15 = splitter * *pd - (splitter * *pd - *pd);
  dVar16 = splitter * pe[1] - (splitter * pe[1] - pe[1]);
  dVar15 = (*pd - dVar15) * (pe[1] - dVar16) +
           -(-dVar15 * (pe[1] - dVar16) + -(*pd - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pe * pd[1];
  dVar17 = splitter * *pe - (splitter * *pe - *pe);
  dVar18 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar17 = (*pe - dVar17) * (pd[1] - dVar18) +
           -(-dVar17 * (pd[1] - dVar18) + -(*pe - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  ea[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  de[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  de[2] = dVar15 + dVar17;
  de[1] = (dVar15 - (de[2] - (de[2] - dVar15))) + (dVar17 - (de[2] - dVar15));
  dVar14 = *pe * pa[1];
  dVar15 = splitter * *pe - (splitter * *pe - *pe);
  dVar16 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar15 = (*pe - dVar15) * (pa[1] - dVar16) +
           -(-dVar15 * (pa[1] - dVar16) + -(*pe - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pa * pe[1];
  dVar17 = splitter * *pa - (splitter * *pa - *pa);
  dVar18 = splitter * pe[1] - (splitter * pe[1] - pe[1]);
  dVar17 = (*pa - dVar17) * (pe[1] - dVar18) +
           -(-dVar17 * (pe[1] - dVar18) + -(*pa - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  ac[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  ea[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  ea[2] = dVar15 + dVar17;
  ea[1] = (dVar15 - (ea[2] - (ea[2] - dVar15))) + (dVar17 - (ea[2] - dVar15));
  dVar14 = *pa * pc[1];
  dVar15 = splitter * *pa - (splitter * *pa - *pa);
  dVar16 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar15 = (*pa - dVar15) * (pc[1] - dVar16) +
           -(-dVar15 * (pc[1] - dVar16) + -(*pa - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pc * pa[1];
  dVar17 = splitter * *pc - (splitter * *pc - *pc);
  dVar18 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar17 = (*pc - dVar17) * (pa[1] - dVar18) +
           -(-dVar17 * (pa[1] - dVar18) + -(*pc - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  bd[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  ac[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  ac[2] = dVar15 + dVar17;
  ac[1] = (dVar15 - (ac[2] - (ac[2] - dVar15))) + (dVar17 - (ac[2] - dVar15));
  dVar14 = *pb * pd[1];
  dVar15 = splitter * *pb - (splitter * *pb - *pb);
  dVar16 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar15 = (*pb - dVar15) * (pd[1] - dVar16) +
           -(-dVar15 * (pd[1] - dVar16) + -(*pb - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pd * pb[1];
  dVar17 = splitter * *pd - (splitter * *pd - *pd);
  dVar18 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar17 = (*pd - dVar17) * (pb[1] - dVar18) +
           -(-dVar17 * (pb[1] - dVar18) + -(*pd - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  ce[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  bd[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  bd[2] = dVar15 + dVar17;
  bd[1] = (dVar15 - (bd[2] - (bd[2] - dVar15))) + (dVar17 - (bd[2] - dVar15));
  dVar14 = *pc * pe[1];
  dVar15 = splitter * *pc - (splitter * *pc - *pc);
  dVar16 = splitter * pe[1] - (splitter * pe[1] - pe[1]);
  dVar15 = (*pc - dVar15) * (pe[1] - dVar16) +
           -(-dVar15 * (pe[1] - dVar16) + -(*pc - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pe * pc[1];
  dVar17 = splitter * *pe - (splitter * *pe - *pe);
  dVar18 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar17 = (*pe - dVar17) * (pc[1] - dVar18) +
           -(-dVar17 * (pc[1] - dVar18) + -(*pe - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  da[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  ce[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  ce[2] = dVar15 + dVar17;
  ce[1] = (dVar15 - (ce[2] - (ce[2] - dVar15))) + (dVar17 - (ce[2] - dVar15));
  dVar14 = *pd * pa[1];
  dVar15 = splitter * *pd - (splitter * *pd - *pd);
  dVar16 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar15 = (*pd - dVar15) * (pa[1] - dVar16) +
           -(-dVar15 * (pa[1] - dVar16) + -(*pd - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pa * pd[1];
  dVar17 = splitter * *pa - (splitter * *pa - *pa);
  dVar18 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar17 = (*pa - dVar17) * (pd[1] - dVar18) +
           -(-dVar17 * (pd[1] - dVar18) + -(*pa - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  eb[3] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  da[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  da[2] = dVar15 + dVar17;
  da[1] = (dVar15 - (da[2] - (da[2] - dVar15))) + (dVar17 - (da[2] - dVar15));
  dVar14 = *pe * pb[1];
  dVar15 = splitter * *pe - (splitter * *pe - *pe);
  dVar16 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar15 = (*pe - dVar15) * (pb[1] - dVar16) +
           -(-dVar15 * (pb[1] - dVar16) + -(*pe - dVar15) * dVar16 + -dVar15 * dVar16 + dVar14);
  dVar16 = *pb * pe[1];
  dVar17 = splitter * *pb - (splitter * *pb - *pb);
  dVar18 = splitter * pe[1] - (splitter * pe[1] - pe[1]);
  dVar17 = (*pb - dVar17) * (pe[1] - dVar18) +
           -(-dVar17 * (pe[1] - dVar18) + -(*pb - dVar17) * dVar18 + -dVar17 * dVar18 + dVar16);
  dVar18 = dVar15 - dVar17;
  temp8a[7] = (dVar15 - (dVar18 + (dVar15 - dVar18))) + ((dVar15 - dVar18) - dVar17);
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar17 = dVar14 - dVar16;
  eb[0] = (dVar14 - (dVar17 + (dVar14 - dVar17))) + ((dVar14 - dVar17) - dVar16);
  eb[2] = dVar15 + dVar17;
  eb[1] = (dVar15 - (eb[2] - (eb[2] - dVar15))) + (dVar17 - (eb[2] - dVar15));
  iVar1 = scale_expansion_zeroelim(4,cd + 3,pa[2],temp8b + 7);
  iVar2 = scale_expansion_zeroelim(4,bd + 3,-pb[2],temp16 + 0xf);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,temp8b + 7,iVar2,temp16 + 0xf,(double *)&temp8blen);
  iVar2 = scale_expansion_zeroelim(4,bc + 3,pc[2],temp8b + 7);
  iVar1 = fast_expansion_sum_zeroelim(iVar2,temp8b + 7,iVar1,(double *)&temp8blen,bcd + 0x17);
  iVar2 = scale_expansion_zeroelim(4,de + 3,pb[2],temp8b + 7);
  iVar3 = scale_expansion_zeroelim(4,ce + 3,-pc[2],temp16 + 0xf);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,temp8b + 7,iVar3,temp16 + 0xf,(double *)&temp8blen);
  iVar3 = scale_expansion_zeroelim(4,cd + 3,pd[2],temp8b + 7);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,temp8b + 7,iVar2,(double *)&temp8blen,cde + 0x17);
  iVar3 = scale_expansion_zeroelim(4,ea + 3,pc[2],temp8b + 7);
  iVar4 = scale_expansion_zeroelim(4,da + 3,-pd[2],temp16 + 0xf);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,temp8b + 7,iVar4,temp16 + 0xf,(double *)&temp8blen);
  iVar4 = scale_expansion_zeroelim(4,de + 3,pe[2],temp8b + 7);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,temp8b + 7,iVar3,(double *)&temp8blen,dea + 0x17);
  iVar4 = scale_expansion_zeroelim(4,ac + 3,pd[2],temp8b + 7);
  iVar5 = scale_expansion_zeroelim(4,eb + 3,-pe[2],temp16 + 0xf);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,temp8b + 7,iVar5,temp16 + 0xf,(double *)&temp8blen);
  iVar5 = scale_expansion_zeroelim(4,ea + 3,pa[2],temp8b + 7);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,temp8b + 7,iVar4,(double *)&temp8blen,eab + 0x17);
  iVar5 = scale_expansion_zeroelim(4,bc + 3,pe[2],temp8b + 7);
  iVar6 = scale_expansion_zeroelim(4,temp8a + 7,-pa[2],temp16 + 0xf);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,temp8b + 7,iVar6,temp16 + 0xf,(double *)&temp8blen);
  iVar6 = scale_expansion_zeroelim(4,ac + 3,pb[2],temp8b + 7);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,temp8b + 7,iVar5,(double *)&temp8blen,abd + 0x17);
  iVar6 = scale_expansion_zeroelim(4,ce + 3,pa[2],temp8b + 7);
  iVar7 = scale_expansion_zeroelim(4,eb + 3,pb[2],temp16 + 0xf);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,temp8b + 7,iVar7,temp16 + 0xf,(double *)&temp8blen);
  iVar7 = scale_expansion_zeroelim(4,bc + 3,pd[2],temp8b + 7);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,temp8b + 7,iVar6,(double *)&temp8blen,bce + 0x17);
  iVar7 = scale_expansion_zeroelim(4,da + 3,pb[2],temp8b + 7);
  iVar8 = scale_expansion_zeroelim(4,temp8a + 7,pc[2],temp16 + 0xf);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,temp8b + 7,iVar8,temp16 + 0xf,(double *)&temp8blen);
  iVar8 = scale_expansion_zeroelim(4,cd + 3,pe[2],temp8b + 7);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,temp8b + 7,iVar7,(double *)&temp8blen,cda + 0x17);
  iVar8 = scale_expansion_zeroelim(4,eb + 3,pc[2],temp8b + 7);
  iVar9 = scale_expansion_zeroelim(4,bd + 3,pd[2],temp16 + 0xf);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,temp8b + 7,iVar9,temp16 + 0xf,(double *)&temp8blen);
  iVar9 = scale_expansion_zeroelim(4,de + 3,pa[2],temp8b + 7);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,temp8b + 7,iVar8,(double *)&temp8blen,deb + 0x17);
  iVar9 = scale_expansion_zeroelim(4,temp8a + 7,pd[2],temp8b + 7);
  iVar10 = scale_expansion_zeroelim(4,ce + 3,pe[2],temp16 + 0xf);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,temp8b + 7,iVar10,temp16 + 0xf,(double *)&temp8blen);
  iVar10 = scale_expansion_zeroelim(4,ea + 3,pb[2],temp8b + 7);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,temp8b + 7,iVar9,(double *)&temp8blen,eac + 0x17);
  iVar10 = scale_expansion_zeroelim(4,bd + 3,pe[2],temp8b + 7);
  iVar11 = scale_expansion_zeroelim(4,da + 3,pa[2],temp16 + 0xf);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,temp8b + 7,iVar11,temp16 + 0xf,(double *)&temp8blen);
  iVar11 = scale_expansion_zeroelim(4,ac + 3,pc[2],temp8b + 7);
  iVar10 = fast_expansion_sum_zeroelim
                     (iVar11,temp8b + 7,iVar10,(double *)&temp8blen,(double *)&bcdlen);
  iVar11 = fast_expansion_sum_zeroelim(iVar3,dea + 0x17,iVar7,cda + 0x17,temp48b + 0x2f);
  iVar12 = fast_expansion_sum_zeroelim(iVar9,eac + 0x17,iVar2,cde + 0x17,(double *)&temp48blen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar12; bvirt._0_4_ = bvirt._0_4_ + 1) {
    *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) =
         *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) ^ 0x8000000000000000;
  }
  iVar11 = fast_expansion_sum_zeroelim
                     (iVar11,temp48b + 0x2f,iVar12,(double *)&temp48blen,cdea + 0x5f);
  iVar12 = scale_expansion_zeroelim(iVar11,cdea + 0x5f,*pa,det384x + 0x17f);
  iVar12 = scale_expansion_zeroelim(iVar12,det384x + 0x17f,*pa,det384y + 0x17f);
  iVar13 = scale_expansion_zeroelim(iVar11,cdea + 0x5f,pa[1],det384x + 0x17f);
  iVar13 = scale_expansion_zeroelim(iVar13,det384x + 0x17f,pa[1],det384z + 0x17f);
  detxy[0x2ff]._4_4_ = scale_expansion_zeroelim(iVar11,cdea + 0x5f,pa[2],det384x + 0x17f);
  detxy[0x2ff]._4_4_ =
       scale_expansion_zeroelim(detxy[0x2ff]._4_4_,det384x + 0x17f,pa[2],(double *)&ylen);
  iVar11 = fast_expansion_sum_zeroelim
                     (iVar12,det384y + 0x17f,iVar13,det384z + 0x17f,
                      (double *)&stack0xffffffffffffa048);
  iVar11 = fast_expansion_sum_zeroelim
                     (iVar11,(double *)&stack0xffffffffffffa048,detxy[0x2ff]._4_4_,(double *)&ylen,
                      bdet + 0x47f);
  iVar12 = fast_expansion_sum_zeroelim(iVar4,eab + 0x17,iVar8,deb + 0x17,temp48b + 0x2f);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar10,(double *)&bcdlen,iVar3,dea + 0x17,(double *)&temp48blen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar3; bvirt._0_4_ = bvirt._0_4_ + 1) {
    *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) =
         *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) ^ 0x8000000000000000;
  }
  iVar3 = fast_expansion_sum_zeroelim(iVar12,temp48b + 0x2f,iVar3,(double *)&temp48blen,deab + 0x5f)
  ;
  iVar12 = scale_expansion_zeroelim(iVar3,deab + 0x5f,*pb,det384x + 0x17f);
  iVar12 = scale_expansion_zeroelim(iVar12,det384x + 0x17f,*pb,det384y + 0x17f);
  iVar13 = scale_expansion_zeroelim(iVar3,deab + 0x5f,pb[1],det384x + 0x17f);
  iVar13 = scale_expansion_zeroelim(iVar13,det384x + 0x17f,pb[1],det384z + 0x17f);
  detxy[0x2ff]._4_4_ = scale_expansion_zeroelim(iVar3,deab + 0x5f,pb[2],det384x + 0x17f);
  detxy[0x2ff]._4_4_ =
       scale_expansion_zeroelim(detxy[0x2ff]._4_4_,det384x + 0x17f,pb[2],(double *)&ylen);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar12,det384y + 0x17f,iVar13,det384z + 0x17f,
                     (double *)&stack0xffffffffffffa048);
  iVar3 = fast_expansion_sum_zeroelim
                    (iVar3,(double *)&stack0xffffffffffffa048,detxy[0x2ff]._4_4_,(double *)&ylen,
                     cdet + 0x47f);
  iVar9 = fast_expansion_sum_zeroelim(iVar5,abd + 0x17,iVar9,eac + 0x17,temp48b + 0x2f);
  iVar4 = fast_expansion_sum_zeroelim(iVar6,bce + 0x17,iVar4,eab + 0x17,(double *)&temp48blen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar4; bvirt._0_4_ = bvirt._0_4_ + 1) {
    *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) =
         *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) ^ 0x8000000000000000;
  }
  iVar4 = fast_expansion_sum_zeroelim(iVar9,temp48b + 0x2f,iVar4,(double *)&temp48blen,eabc + 0x5f);
  iVar9 = scale_expansion_zeroelim(iVar4,eabc + 0x5f,*pc,det384x + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar9,det384x + 0x17f,*pc,det384y + 0x17f);
  iVar12 = scale_expansion_zeroelim(iVar4,eabc + 0x5f,pc[1],det384x + 0x17f);
  iVar12 = scale_expansion_zeroelim(iVar12,det384x + 0x17f,pc[1],det384z + 0x17f);
  detxy[0x2ff]._4_4_ = scale_expansion_zeroelim(iVar4,eabc + 0x5f,pc[2],det384x + 0x17f);
  detxy[0x2ff]._4_4_ =
       scale_expansion_zeroelim(detxy[0x2ff]._4_4_,det384x + 0x17f,pc[2],(double *)&ylen);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar9,det384y + 0x17f,iVar12,det384z + 0x17f,(double *)&stack0xffffffffffffa048
                    );
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar4,(double *)&stack0xffffffffffffa048,detxy[0x2ff]._4_4_,(double *)&ylen,
                     ddet + 0x47f);
  iVar9 = fast_expansion_sum_zeroelim(iVar1,bcd + 0x17,iVar10,(double *)&bcdlen,temp48b + 0x2f);
  iVar5 = fast_expansion_sum_zeroelim(iVar7,cda + 0x17,iVar5,abd + 0x17,(double *)&temp48blen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar5; bvirt._0_4_ = bvirt._0_4_ + 1) {
    *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) =
         *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) ^ 0x8000000000000000;
  }
  iVar5 = fast_expansion_sum_zeroelim
                    (iVar9,temp48b + 0x2f,iVar5,(double *)&temp48blen,(double *)&bcdelen);
  iVar7 = scale_expansion_zeroelim(iVar5,(double *)&bcdelen,*pd,det384x + 0x17f);
  iVar7 = scale_expansion_zeroelim(iVar7,det384x + 0x17f,*pd,det384y + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar5,(double *)&bcdelen,pd[1],det384x + 0x17f);
  iVar9 = scale_expansion_zeroelim(iVar9,det384x + 0x17f,pd[1],det384z + 0x17f);
  detxy[0x2ff]._4_4_ = scale_expansion_zeroelim(iVar5,(double *)&bcdelen,pd[2],det384x + 0x17f);
  detxy[0x2ff]._4_4_ =
       scale_expansion_zeroelim(detxy[0x2ff]._4_4_,det384x + 0x17f,pd[2],(double *)&ylen);
  iVar5 = fast_expansion_sum_zeroelim
                    (iVar7,det384y + 0x17f,iVar9,det384z + 0x17f,(double *)&stack0xffffffffffffa048)
  ;
  iVar5 = fast_expansion_sum_zeroelim
                    (iVar5,(double *)&stack0xffffffffffffa048,detxy[0x2ff]._4_4_,(double *)&ylen,
                     edet + 0x47f);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,cde + 0x17,iVar6,bce + 0x17,temp48b + 0x2f);
  iVar1 = fast_expansion_sum_zeroelim(iVar8,deb + 0x17,iVar1,bcd + 0x17,(double *)&temp48blen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < iVar1; bvirt._0_4_ = bvirt._0_4_ + 1) {
    *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) =
         *(ulong *)(&temp48blen + (long)bvirt._0_4_ * 2) ^ 0x8000000000000000;
  }
  iVar1 = fast_expansion_sum_zeroelim(iVar2,temp48b + 0x2f,iVar1,(double *)&temp48blen,bcde + 0x5f);
  iVar2 = scale_expansion_zeroelim(iVar1,bcde + 0x5f,*pe,det384x + 0x17f);
  iVar2 = scale_expansion_zeroelim(iVar2,det384x + 0x17f,*pe,det384y + 0x17f);
  iVar6 = scale_expansion_zeroelim(iVar1,bcde + 0x5f,pe[1],det384x + 0x17f);
  iVar6 = scale_expansion_zeroelim(iVar6,det384x + 0x17f,pe[1],det384z + 0x17f);
  detxy[0x2ff]._4_4_ = scale_expansion_zeroelim(iVar1,bcde + 0x5f,pe[2],det384x + 0x17f);
  detxy[0x2ff]._4_4_ =
       scale_expansion_zeroelim(detxy[0x2ff]._4_4_,det384x + 0x17f,pe[2],(double *)&ylen);
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar2,det384y + 0x17f,iVar6,det384z + 0x17f,(double *)&stack0xffffffffffffa048)
  ;
  iVar1 = fast_expansion_sum_zeroelim
                    (iVar1,(double *)&stack0xffffffffffffa048,detxy[0x2ff]._4_4_,(double *)&ylen,
                     (double *)&blen);
  iVar2 = fast_expansion_sum_zeroelim(iVar11,bdet + 0x47f,iVar3,cdet + 0x47f,cddet + 0x8ff);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,ddet + 0x47f,iVar5,edet + 0x47f,cdedet + 0xd7f);
  iVar1 = fast_expansion_sum_zeroelim(iVar3,cdedet + 0xd7f,iVar1,(double *)&blen,(double *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim(iVar2,cddet + 0x8ff,iVar1,(double *)&cdlen,(double *)&i);
  return *(double *)(&i + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL insphereexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL temp192[192];
  REAL det384x[384], det384y[384], det384z[384];
  int xlen, ylen, zlen;
  REAL detxy[768];
  int xylen;
  REAL adet[1152], bdet[1152], cdet[1152], ddet[1152], edet[1152];
  int alen, blen, clen, dlen, elen;
  REAL abdet[2304], cddet[2304], cdedet[3456];
  int ablen, cdlen;
  REAL deter[5760];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  xlen = scale_expansion_zeroelim(bcdelen, bcde, pa[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pa[0], det384x);
  ylen = scale_expansion_zeroelim(bcdelen, bcde, pa[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pa[1], det384y);
  zlen = scale_expansion_zeroelim(bcdelen, bcde, pa[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pa[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  alen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  xlen = scale_expansion_zeroelim(cdealen, cdea, pb[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pb[0], det384x);
  ylen = scale_expansion_zeroelim(cdealen, cdea, pb[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pb[1], det384y);
  zlen = scale_expansion_zeroelim(cdealen, cdea, pb[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pb[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  blen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  xlen = scale_expansion_zeroelim(deablen, deab, pc[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pc[0], det384x);
  ylen = scale_expansion_zeroelim(deablen, deab, pc[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pc[1], det384y);
  zlen = scale_expansion_zeroelim(deablen, deab, pc[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pc[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  clen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  xlen = scale_expansion_zeroelim(eabclen, eabc, pd[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pd[0], det384x);
  ylen = scale_expansion_zeroelim(eabclen, eabc, pd[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pd[1], det384y);
  zlen = scale_expansion_zeroelim(eabclen, eabc, pd[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pd[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  dlen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  xlen = scale_expansion_zeroelim(abcdlen, abcd, pe[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pe[0], det384x);
  ylen = scale_expansion_zeroelim(abcdlen, abcd, pe[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pe[1], det384y);
  zlen = scale_expansion_zeroelim(abcdlen, abcd, pe[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pe[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  elen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}